

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

QByteArray * __thiscall
QHttpHeaders::combinedValue
          (QByteArray *__return_storage_ptr__,QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *this_00;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 local_41;
  HeaderName local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = (this->d).d.ptr;
  if ((this_00 != (QHttpHeadersPrivate *)0x0) && ((this_00->headers).d.size != 0)) {
    HeaderName::HeaderName(&local_40,name);
    QHttpHeadersPrivate::combinedValue(this_00,&local_40,__return_storage_ptr__);
    if ((long)(char)local_40.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
        != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(char)local_40.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index].
        _M_data)(&local_41,&local_40.data);
      local_40.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index = 0xff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QHttpHeaders::combinedValue(QAnyStringView name) const
{
    QByteArray result;
    if (isEmpty())
        return result;

    d->combinedValue(HeaderName{name}, result);
    return result;
}